

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::InternalEnterCriticalSection(CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  PalCsInitState PVar1;
  uint uVar2;
  LONG LVar3;
  PalCsWaiterReturnState PVar4;
  HANDLE pVVar5;
  int *Destination;
  bool bVar6;
  SIZE_T threadId;
  PalCsWaiterReturnState cwrs;
  LONG lWaitInc;
  LONG lBitsToChange;
  LONG lNewVal;
  LONG lVal;
  LONG lSpinCount;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  PCRITICAL_SECTION pCriticalSection_local;
  CPalThread *pThread_local;
  
  PVar1 = Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if (PVar1 == PalCsNotInitialized) {
    fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x2c4);
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar5 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,"InternalEnterCriticalSection");
  uVar2 = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
  if (((uVar2 & 1) != 0) && (pCriticalSection->OwningThread == pVVar5)) {
    pCriticalSection->RecursionCount = pCriticalSection->RecursionCount + 1;
    if (pCriticalSection->DebugInfo != (PVOID)0x0) {
      Volatile<unsigned_int>::operator+=
                ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x1c),1);
    }
    return;
  }
  cwrs = PalCsWaiterDidntWait;
  threadId._4_4_ = 4;
  lNewVal = (LONG)pCriticalSection->SpinCount;
  do {
    if ((cwrs != PalCsWaiterDidntWait) && (cwrs != 3)) {
      fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x2ea);
      fprintf(_stderr,
              "Expression: PALCS_LOCK_BIT == lBitsToChange || (PALCS_LOCK_BIT | PALCS_LOCK_AWAKENED_WAITER) == lBitsToChange\n"
             );
    }
    if ((threadId._4_4_ != 4) && (threadId._4_4_ != 2)) {
      fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x2ee);
      fprintf(_stderr,
              "Expression: PALCS_LOCK_WAITER_INC == lWaitInc || PALCS_LOCK_AWAKENED_WAITER == lWaitInc\n"
             );
    }
    do {
      lBitsToChange = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
      while ((lBitsToChange & 1U) == 0) {
        if ((cwrs != PalCsWaiterDidntWait) && ((lBitsToChange & 2U) == 0)) {
          fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x2fa);
          fprintf(_stderr,
                  "Expression: (PALCS_LOCK_BIT == lBitsToChange) || (PALCS_LOCK_AWAKENED_WAITER & lVal)\n"
                 );
        }
        if (((lBitsToChange ^ cwrs) & PalCsWaiterDidntWait) == PalCsReturnWaiterAwakened) {
          fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x2ff);
          fprintf(_stderr,"Expression: lNewVal & PALCS_LOCK_BIT\n");
        }
        Destination = Volatile<int>::operator&((Volatile<int> *)&pCriticalSection->LockCount);
        LVar3 = InterlockedCompareExchange(Destination,lBitsToChange ^ cwrs,lBitsToChange);
        bVar6 = LVar3 == lBitsToChange;
        lBitsToChange = LVar3;
        if (bVar6) {
          pCriticalSection->OwningThread = pVVar5;
          pCriticalSection->RecursionCount = 1;
          if (pCriticalSection->DebugInfo == (PVOID)0x0) {
            return;
          }
          Volatile<unsigned_int>::operator+=
                    ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x18),1);
          Volatile<unsigned_int>::operator+=
                    ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x1c),1);
          return;
        }
      }
      if (0 < lNewVal) {
        sched_yield();
      }
      lNewVal = lNewVal + -1;
    } while (-1 < lNewVal);
    PVar4 = PALCS_WaitOnCS((PAL_CRITICAL_SECTION *)pCriticalSection,threadId._4_4_);
    if (PVar4 == PalCsReturnWaiterAwakened) {
      uVar2 = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
      if ((uVar2 & 2) == 0) {
        fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                ,0x336);
        fprintf(_stderr,"Expression: PALCS_LOCK_AWAKENED_WAITER & pPalCriticalSection->LockCount\n")
        ;
      }
      cwrs = 3;
      threadId._4_4_ = 2;
    }
  } while( true );
}

Assistant:

void InternalEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

        LONG lSpinCount;
        LONG lVal, lNewVal;
        LONG lBitsToChange, lWaitInc;
        PalCsWaiterReturnState cwrs;
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);


        // Check if the current thread already owns the CS
        //
        // Note: there is no need for this double check to be atomic. In fact
        // if the first check fails, the second doesn't count (and it's not
        // even executed). If the first one succeeds and the second one
        // doesn't, it doesn't matter if LockCount has already changed by the
        // time OwningThread is tested. Instead, if the first one succeeded,
        // and the second also succeeds, LockCount cannot have changed in the
        // meanwhile, since this is the owning thread and only the owning
        // thread can change the lock bit when the CS is owned.
        if ((pPalCriticalSection->LockCount & PALCS_LOCK_BIT) &&
            (pPalCriticalSection->OwningThread == threadId))
        {
            pPalCriticalSection->RecursionCount += 1;
#ifdef _DEBUG
            if (NULL != pPalCriticalSection->DebugInfo)
            {
                pPalCriticalSection->DebugInfo->lEnterCount += 1;
            }
#endif // _DEBUG
            goto IECS_exit;
        }

        // Set bits to change and waiter increment for an incoming thread
        lBitsToChange = PALCS_LOCK_BIT;
        lWaitInc = PALCS_LOCK_WAITER_INC;
        lSpinCount = pPalCriticalSection->SpinCount;

        while (TRUE)
        {
            // Either this is an incoming thread, and therefore lBitsToChange
            // is just PALCS_LOCK_BIT, or this is an awakened waiter
            _ASSERTE(PALCS_LOCK_BIT == lBitsToChange ||
                     (PALCS_LOCK_BIT | PALCS_LOCK_AWAKENED_WAITER) == lBitsToChange);

            // Make sure the waiter increment is in a valid range
            _ASSERTE(PALCS_LOCK_WAITER_INC == lWaitInc ||
                     PALCS_LOCK_AWAKENED_WAITER == lWaitInc);

            do {
                lVal = pPalCriticalSection->LockCount;

                while (0 == (lVal & PALCS_LOCK_BIT))
                {
                    // CS is not locked: try lo lock it

                    // Make sure that whether we are an incoming thread
                    // or the PALCS_LOCK_AWAKENED_WAITER bit is set
                    _ASSERTE((PALCS_LOCK_BIT == lBitsToChange) ||
                             (PALCS_LOCK_AWAKENED_WAITER & lVal));

                    lNewVal = lVal ^ lBitsToChange;

                    // Make sure we are actually trying to lock
                    _ASSERTE(lNewVal & PALCS_LOCK_BIT);

                    CS_TRACE("[ECS %p] Switching from {%d, %d, %d} to "
                        "{%d, %d, %d} ==>\n", pPalCriticalSection,
                        PALCS_GETWCOUNT(lVal), PALCS_GETAWBIT(lVal), PALCS_GETLBIT(lVal),
                        PALCS_GETWCOUNT(lNewVal), PALCS_GETAWBIT(lNewVal), PALCS_GETLBIT(lNewVal));

                    // Try to switch the value
                    lNewVal = InterlockedCompareExchange (&pPalCriticalSection->LockCount,
                                                         lNewVal, lVal);

                    CS_TRACE("[ECS %p] ==> %s LockCount={%d, %d, %d} "
                        "lVal={%d, %d, %d}\n", pPalCriticalSection,
                        (lNewVal == lVal) ? "OK" : "NO",
                        PALCS_GETWCOUNT(pPalCriticalSection->LockCount),
                        PALCS_GETAWBIT(pPalCriticalSection->LockCount),
                        PALCS_GETLBIT(pPalCriticalSection->LockCount),
                        PALCS_GETWCOUNT(lVal), PALCS_GETAWBIT(lVal), PALCS_GETLBIT(lVal));

                    if (lNewVal == lVal)
                    {
                        // CS successfully acquired
                        goto IECS_set_ownership;
                    }

                    // Acquisition failed, some thread raced with us;
                    // update value for next loop
                    lVal = lNewVal;
                }

                if (0 < lSpinCount)
                {
                    sched_yield();
                }
            } while (0 <= --lSpinCount);

            cwrs = PALCS_WaitOnCS(pPalCriticalSection, lWaitInc);

            if (PalCsReturnWaiterAwakened == cwrs)
            {
#ifdef PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                //
                // Fair Critical Sections
                //
                // In the fair lock case, when a waiter wakes up the CS
                // must be locked (i.e. ownership passed on to the waiter)
                _ASSERTE(0 != (PALCS_LOCK_BIT & pPalCriticalSection->LockCount));

                // CS successfully acquired
                goto IECS_set_ownership;

#else // PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                //
                // Unfair Critical Sections
                //
                _ASSERTE(PALCS_LOCK_AWAKENED_WAITER & pPalCriticalSection->LockCount);

                lBitsToChange = PALCS_LOCK_BIT | PALCS_LOCK_AWAKENED_WAITER;
                lWaitInc = PALCS_LOCK_AWAKENED_WAITER;
#endif // PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
            }
        }

    IECS_set_ownership:
        // Critical section acquired: set ownership data
        pPalCriticalSection->OwningThread = threadId;
        pPalCriticalSection->RecursionCount = 1;
#ifdef _DEBUG
        if (NULL != pPalCriticalSection->DebugInfo)
        {
            pPalCriticalSection->DebugInfo->lAcquireCount += 1;
            pPalCriticalSection->DebugInfo->lEnterCount += 1;
        }
#endif // _DEBUG

    IECS_exit:
        return;
    }